

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O1

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::SetSideEffects
          (ScriptContextOptimizationOverrideInfo *this,SideEffects se)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContextOptimizationOverrideInfo *pSVar4;
  
  if (this->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
    this->sideEffects = this->sideEffects | se;
  }
  else if ((se & ~this->sideEffects) != SideEffects_None) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pSVar4 = this;
    do {
      if ((se & ~pSVar4->sideEffects) == SideEffects_None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0xaf,"((info->sideEffects & se) != se)",
                                    "(info->sideEffects & se) != se");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      pSVar4->sideEffects = pSVar4->sideEffects | se;
      pSVar4 = pSVar4->crossSiteNext;
    } while (pSVar4 != this);
  }
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::SetSideEffects(SideEffects se)
{
    if (this->crossSiteRoot == nullptr)
    {
        sideEffects = (SideEffects)(sideEffects | se);
    }
    else if ((sideEffects & se) != se)
    {
        ForEachCrossSiteInfo([se](ScriptContextOptimizationOverrideInfo * info)
        {
            Assert((info->sideEffects & se) != se);
            info->sideEffects = (SideEffects)(info->sideEffects | se);
        });
    }
}